

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int entity6(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  if (tok == 0xf) {
    return 0xb;
  }
  if (tok == 0x12) {
    state->handler = declClose;
    state->role_none = 0xb;
    return 0x10;
  }
  state->handler = error;
  return -1;
}

Assistant:

static int PTRCALL
entity6(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
        const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ENTITY_NONE;
  case XML_TOK_NAME:
    state->handler = declClose;
    state->role_none = XML_ROLE_ENTITY_NONE;
    return XML_ROLE_ENTITY_NOTATION_NAME;
  }
  return common(state, tok);
}